

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser.cpp
# Opt level: O3

FieldInfo __thiscall QDateTimeParser::fieldInfo(QDateTimeParser *this,int index)

{
  Section s;
  int *piVar1;
  long lVar2;
  QFlagsStorage<QDateTimeParser::FieldInfoFlag> QVar3;
  SectionNode *pSVar4;
  ushort *puVar5;
  QFlagsStorage<QDateTimeParser::FieldInfoFlag> QVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QMessageLogger local_60;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar4 = sectionNode(this,index);
  s = pSVar4->type;
  if ((int)s < 0x100) {
    if ((int)s < 0x10) {
      switch(s) {
      case AmPmSection:
        getAmPmText((QString *)&local_60,this,AmText,pSVar4->count);
        lVar2 = CONCAT44(local_60.context.function._4_4_,local_60.context.function._0_4_);
        getAmPmText(&local_40,this,PmText,pSVar4->count);
        if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
          }
        }
        piVar1 = (int *)CONCAT44(local_60.context.line,local_60.context.version);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_60.context.line,local_60.context.version),2,0x10
                      );
          }
        }
        bVar7 = lVar2 == local_40.d.size;
LAB_0040b2b8:
        QVar6.i = (uint)bVar7 * 2;
        goto LAB_0040b2f2;
      case MSecSection:
        QVar3.i = 0xd;
        break;
      default:
        goto switchD_0040b1d4_caseD_3;
      case SecondSection:
      case MinuteSection:
switchD_0040b1d4_caseD_4:
        QVar3.i = 5;
      }
LAB_0040b2c6:
      QVar6.i = QVar3.i | 2;
      if (pSVar4->count == 1) {
        QVar6.i = QVar3.i;
      }
      goto LAB_0040b2f2;
    }
    if ((s == Hour12Section) || (s == Hour24Section)) goto switchD_0040b1d4_caseD_4;
    QVar6.i = 0;
    if (s == TimeZoneSection) goto LAB_0040b2f2;
  }
  else if ((int)s < 0x800) {
    if ((s == DaySection) || (s == MonthSection)) {
      QVar6.i = 7;
      if (pSVar4->count != 2) {
        QVar6.i = (uint)(pSVar4->count == 1) * 5;
      }
      goto LAB_0040b2f2;
    }
    QVar3.i = 1;
    if (s == YearSection) goto LAB_0040b2c6;
  }
  else {
    if (s == YearSection2Digits) goto switchD_0040b1d4_caseD_4;
    if ((s == DayOfWeekSectionShort) || (s == DayOfWeekSectionLong)) {
      bVar7 = pSVar4->count == 3;
      goto LAB_0040b2b8;
    }
  }
switchD_0040b1d4_caseD_3:
  local_60.context.version = 2;
  local_60.context.line = 0;
  local_60.context.file._0_4_ = 0;
  local_60.context.file._4_4_ = 0;
  local_60.context.function._0_4_ = 0;
  local_60.context.function._4_4_ = 0;
  local_60.context.category = "default";
  SectionNode::name(&local_40,s);
  puVar5 = QString::utf16(&local_40);
  QMessageLogger::warning
            (&local_60,"QDateTimeParser::fieldInfo Internal error 2 (%d %ls %d)",index,puVar5,
             (ulong)(uint)pSVar4->count);
  fieldInfo();
  QVar6.i = 0;
LAB_0040b2f2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QFlagsStorageHelper<QDateTimeParser::FieldInfoFlag,_4>)
           (QFlagsStorageHelper<QDateTimeParser::FieldInfoFlag,_4>)QVar6.i;
  }
  __stack_chk_fail();
}

Assistant:

QDateTimeParser::FieldInfo QDateTimeParser::fieldInfo(int index) const
{
    FieldInfo ret;
    const SectionNode &sn = sectionNode(index);
    switch (sn.type) {
    case MSecSection:
        ret |= Fraction;
        Q_FALLTHROUGH();
    case SecondSection:
    case MinuteSection:
    case Hour24Section:
    case Hour12Section:
    case YearSection2Digits:
        ret |= AllowPartial;
        Q_FALLTHROUGH();
    case YearSection:
        ret |= Numeric;
        if (sn.count != 1)
            ret |= FixedWidth;
        break;
    case MonthSection:
    case DaySection:
        switch (sn.count) {
        case 2:
            ret |= FixedWidth;
            Q_FALLTHROUGH();
        case 1:
            ret |= (Numeric|AllowPartial);
            break;
        }
        break;
    case DayOfWeekSectionShort:
    case DayOfWeekSectionLong:
        if (sn.count == 3)
            ret |= FixedWidth;
        break;
    case AmPmSection:
        // Some locales have different length AM and PM texts.
        if (getAmPmText(AmText, Case(sn.count)).size()
            == getAmPmText(PmText, Case(sn.count)).size()) {
            // Only relevant to DateTimeEdit's fixups in parse().
            ret |= FixedWidth;
        }
        break;
    case TimeZoneSection:
        break;
    default:
        qWarning("QDateTimeParser::fieldInfo Internal error 2 (%d %ls %d)",
                 index, qUtf16Printable(sn.name()), sn.count);
        break;
    }
    return ret;
}